

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  bool bVar2;
  MatrixOp op;
  InputType IVar3;
  DataType dataType;
  Precision precision;
  Context *pCVar4;
  int vecSize;
  int vecSize_00;
  DataType DVar5;
  TestNode *node;
  TestNode *node_00;
  char *__rhs;
  char *pcVar6;
  ShaderMatrixCase *pSVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  InputType IVar13;
  InputTypeSpec *pIVar14;
  int numCols;
  ShaderInput matIn;
  string vecMatName;
  allocator<char> local_151;
  TestNode *local_150;
  ShaderInput scalarIn;
  ShaderInput otherMatIn;
  string baseName;
  ShaderInput rowVecIn;
  ShaderInput colVecIn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar9 = 0;
  local_150 = (TestNode *)this;
  do {
    if (lVar9 == 0x13) {
      return 0x13;
    }
    bVar1 = init::ops[lVar9].extendedInputTypeCases;
    pIVar14 = init::reducedInputTypes;
    if (bVar1 != false) {
      pIVar14 = init::extendedInputTypes;
    }
    op = init::ops[lVar9].op;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,((TestNode *)this)->m_testCtx,init::ops[lVar9].name,
               init::ops[lVar9].desc);
    tcu::TestNode::addChild((TestNode *)this,node);
    bVar2 = init::ops[lVar9].createInputTypeGroup;
    for (lVar12 = 0; lVar12 != (ulong)bVar1 * 2 + 1; lVar12 = lVar12 + 1) {
      IVar3 = pIVar14[lVar12].type;
      node_00 = node;
      if (bVar2 != false) {
        node_00 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)node_00,((TestNode *)this)->m_testCtx,pIVar14[lVar12].name,
                   pIVar14[lVar12].desc);
        tcu::TestNode::addChild(node,node_00);
      }
      IVar13 = IVar3;
      if (IVar3 == INPUTTYPE_DYNAMIC) {
        IVar13 = INPUTTYPE_UNIFORM;
      }
      for (lVar11 = 0; lVar11 != 9; lVar11 = lVar11 + 1) {
        dataType = init::matrixTypes[lVar11];
        vecSize = glu::getDataTypeMatrixNumColumns(dataType);
        vecSize_00 = glu::getDataTypeMatrixNumRows(dataType);
        __rhs = glu::getDataTypeName(dataType);
        for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
          precision = init::precisions[lVar10];
          pcVar6 = glu::getPrecisionName(precision);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&otherMatIn,pcVar6,(allocator<char> *)&local_70);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scalarIn,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &otherMatIn,"_");
          std::operator+(&vecMatName,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scalarIn,__rhs);
          std::operator+(&baseName,&vecMatName,"_");
          std::__cxx11::string::~string((string *)&vecMatName);
          std::__cxx11::string::~string((string *)&scalarIn);
          std::__cxx11::string::~string((string *)&otherMatIn);
          matIn.inputType = IVar3;
          matIn.dataType = dataType;
          matIn.precision = precision;
          if (op < OP_COMP_MUL) {
            scalarIn.dataType = TYPE_FLOAT;
            scalarIn.inputType = (op != OP_DIV) + INPUTTYPE_UNIFORM;
            scalarIn.precision = precision;
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::operator+(&vecMatName,&baseName,"float_vertex");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,op,true);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::operator+(&vecMatName,&baseName,"float_fragment");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,op,false);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
            if (op != OP_MUL) goto switchD_00f95e7c_caseD_4;
            DVar5 = glu::getDataTypeFloatVec(vecSize);
            colVecIn.inputType = INPUTTYPE_DYNAMIC;
            colVecIn.dataType = DVar5;
            colVecIn.precision = precision;
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            pcVar8 = glu::getDataTypeName(DVar5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,&baseName,pcVar8);
            std::operator+(&vecMatName,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,"_vertex");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,
                       &colVecIn,OP_MUL,true);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&scalarIn);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)local_150[1]._vptr_TestNode;
            pcVar8 = glu::getDataTypeName(DVar5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,&baseName,pcVar8);
            std::operator+(&vecMatName,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,"_fragment");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,
                       &colVecIn,OP_MUL,false);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&scalarIn);
            DVar5 = glu::getDataTypeFloatVec(vecSize_00);
            rowVecIn.inputType = INPUTTYPE_DYNAMIC;
            rowVecIn.dataType = DVar5;
            rowVecIn.precision = precision;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,pcVar6,&local_151);
            std::operator+(&local_70,&local_50,"_");
            pcVar6 = glu::getDataTypeName(DVar5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &otherMatIn,&local_70,pcVar6);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &otherMatIn,"_");
            std::operator+(&vecMatName,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,__rhs);
            std::__cxx11::string::~string((string *)&scalarIn);
            std::__cxx11::string::~string((string *)&otherMatIn);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_50);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            this = (ShaderMatrixTests *)local_150;
            pCVar4 = (Context *)local_150[1]._vptr_TestNode;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,&vecMatName,"_vertex");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,(char *)scalarIn._0_8_,"Vector-matrix case",&rowVecIn,&matIn,
                       OP_MUL,true);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&scalarIn);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,&vecMatName,"_fragment");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,(char *)scalarIn._0_8_,"Vector-matrix case",&rowVecIn,&matIn,
                       OP_MUL,false);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&scalarIn);
            std::__cxx11::string::~string((string *)&vecMatName);
            for (numCols = 2; numCols != 5; numCols = numCols + 1) {
              DVar5 = glu::getDataTypeMatrix(numCols,vecSize);
              otherMatIn.inputType = IVar13;
              otherMatIn.dataType = DVar5;
              otherMatIn.precision = precision;
              pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
              pcVar6 = glu::getDataTypeName(DVar5);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,&baseName,pcVar6);
              std::operator+(&vecMatName,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,"_vertex");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                         &otherMatIn,OP_MUL,true);
              tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
              std::__cxx11::string::~string((string *)&vecMatName);
              std::__cxx11::string::~string((string *)&scalarIn);
              pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar4 = (Context *)local_150[1]._vptr_TestNode;
              pcVar6 = glu::getDataTypeName(DVar5);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,&baseName,pcVar6);
              std::operator+(&vecMatName,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,"_fragment");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                         &otherMatIn,OP_MUL,false);
              tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
              std::__cxx11::string::~string((string *)&vecMatName);
              std::__cxx11::string::~string((string *)&scalarIn);
              this = (ShaderMatrixTests *)local_150;
            }
            goto switchD_00f95e7c_caseD_7;
          }
          switch(op) {
          case OP_COMP_MUL:
switchD_00f95e7c_caseD_4:
            otherMatIn.inputType = IVar13;
            otherMatIn.dataType = dataType;
            otherMatIn.precision = precision;
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,&baseName,__rhs);
            std::operator+(&vecMatName,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,"_vertex");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                       &otherMatIn,op,true);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&scalarIn);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)local_150[1]._vptr_TestNode;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,&baseName,__rhs);
            std::operator+(&vecMatName,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,"_fragment");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                       &otherMatIn,op,false);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&scalarIn);
            this = (ShaderMatrixTests *)local_150;
            break;
          case OP_OUTER_PRODUCT:
            scalarIn.dataType = glu::getDataTypeFloatVec(vecSize_00);
            scalarIn.inputType = IVar3;
            scalarIn.precision = precision;
            otherMatIn.dataType = glu::getDataTypeFloatVec(vecSize);
            otherMatIn.inputType = IVar13;
            otherMatIn.precision = precision;
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::operator+(&vecMatName,&baseName,"float_vertex");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Vector-vector case",&scalarIn,
                       &otherMatIn,op,true);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::operator+(&vecMatName,&baseName,"float_fragment");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Vector-vector case",&scalarIn,
                       &otherMatIn,op,false);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
            break;
          case OP_TRANSPOSE:
          case OP_UNARY_PLUS:
          case OP_NEGATION:
          case OP_PRE_INCREMENT:
          case OP_PRE_DECREMENT:
          case OP_POST_INCREMENT:
          case OP_POST_DECREMENT:
            goto switchD_00f95e7c_caseD_6;
          }
switchD_00f95e7c_caseD_7:
          if (op - OP_INVERSE < 2 && vecSize == vecSize_00) {
switchD_00f95e7c_caseD_6:
            scalarIn.inputType = INPUTTYPE_LAST;
            scalarIn.dataType = TYPE_LAST;
            scalarIn.precision = PRECISION_LAST;
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::operator+(&vecMatName,&baseName,"float_vertex");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,op,
                       true);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::operator+(&vecMatName,&baseName,"float_fragment");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,op,
                       false);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
          }
          if (((op < OP_LAST) && ((0x58000U >> (op & (OP_SUBTRACT_FROM|OP_ADD_INTO)) & 1) != 0)) ||
             (op == OP_MULTIPLY_INTO && vecSize == vecSize_00)) {
            scalarIn.dataType = dataType;
            scalarIn.inputType = IVar13;
            scalarIn.precision = precision;
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::operator+(&vecMatName,&baseName,"float_vertex");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                       &scalarIn,op,true);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::operator+(&vecMatName,&baseName,"float_fragment");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pCVar4,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                       &scalarIn,op,false);
            tcu::TestNode::addChild(node_00,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&vecMatName);
          }
          std::__cxx11::string::~string((string *)&baseName);
        }
      }
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		MatrixOp		op;
		bool			extendedInputTypeCases; // !< test with const and uniform types too
		bool			createInputTypeGroup;	// !< create group for input types
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true,	true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true,	true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true,	true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true,	true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false,	true	},
		{ "outerproduct",	"Matrix outerProduct() tests",					OP_OUTER_PRODUCT,	false,	true	},
		{ "transpose",		"Matrix transpose() tests",						OP_TRANSPOSE,		false,	true	},
		{ "determinant",	"Matrix determinant() tests",					OP_DETERMINANT,		false,	true	},
		{ "inverse",		"Matrix inverse() tests",						OP_INVERSE,			false,	true	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false,	false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false,	false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false,	false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false,	false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		InputType		type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_LOWP,
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;
			tcu::TestCaseGroup* inGroup;

			if (ops[opNdx].createInputTypeGroup)
			{
				inGroup = new tcu::TestCaseGroup(m_testCtx, inTypeList[inTypeNdx].name, inTypeList[inTypeNdx].desc);
				opGroup->addChild(inGroup);
			}
			else
				inGroup = opGroup;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				int			numCols		= getDataTypeMatrixNumColumns(matType);
				int			numRows		= getDataTypeMatrixNumRows(matType);
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(precName) + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	colVecType	= getDataTypeFloatVec(numCols);
						ShaderInput colVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, colVecType, precision);

						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(colVecType) + "_vertex").c_str(),		"Matrix-vector case", matIn, colVecIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(colVecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, colVecIn, op, false));

						// Vector-matrix.
						DataType	rowVecType	= getDataTypeFloatVec(numRows);
						ShaderInput	rowVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, rowVecType, precision);
						string		vecMatName	= string(precName) + "_" + getDataTypeName(rowVecType) + "_" + matTypeName;

						inGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", rowVecIn, matIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", rowVecIn, matIn, op, false));
					}

					if (isOperationArithmeticMatrixMatrix(op))
					{
						// Arithmetic matrix-matrix multiplication.
						for (int otherCols = 2; otherCols <= 4; otherCols++)
						{
							ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, getDataTypeMatrix(otherCols, numCols /* rows */), precision);
							inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(otherMatIn.dataType) + "_vertex").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, true));
							inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(otherMatIn.dataType) + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
						}
					}
					else if (isOperationComponentwiseMatrixMatrix(op))
					{
						// Component-wise.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationVectorVector(op))
					{
						ShaderInput vec1In(inputType,																getDataTypeFloatVec(numRows), precision);
						ShaderInput vec2In((inputType == INPUTTYPE_DYNAMIC) ? (INPUTTYPE_UNIFORM) : (inputType),	getDataTypeFloatVec(numCols), precision);

						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Vector-vector case", vec1In, vec2In, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Vector-vector case", vec1In, vec2In, op, false));
					}

					if ((isOperationUnaryAnyMatrix(op)) ||
						(isOperationUnarySymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if ((isOperationAssignmentAnyMatrix(op)) ||
						(isOperationAssignmentSymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}